

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_decoder.c
# Opt level: O0

lzma_ret lzma_delta_props_decode
                   (void **options,lzma_allocator *allocator,uint8_t *props,size_t props_size)

{
  undefined4 *puVar1;
  lzma_options_delta *opt;
  size_t props_size_local;
  uint8_t *props_local;
  lzma_allocator *allocator_local;
  void **options_local;
  
  if (props_size == 1) {
    puVar1 = (undefined4 *)lzma_alloc(0x28,allocator);
    if (puVar1 == (undefined4 *)0x0) {
      options_local._4_4_ = LZMA_MEM_ERROR;
    }
    else {
      *puVar1 = 0;
      puVar1[1] = *props + 1;
      *options = puVar1;
      options_local._4_4_ = LZMA_OK;
    }
  }
  else {
    options_local._4_4_ = LZMA_OPTIONS_ERROR;
  }
  return options_local._4_4_;
}

Assistant:

extern lzma_ret
lzma_delta_props_decode(void **options, const lzma_allocator *allocator,
		const uint8_t *props, size_t props_size)
{
	if (props_size != 1)
		return LZMA_OPTIONS_ERROR;

	lzma_options_delta *opt
			= lzma_alloc(sizeof(lzma_options_delta), allocator);
	if (opt == NULL)
		return LZMA_MEM_ERROR;

	opt->type = LZMA_DELTA_TYPE_BYTE;
	opt->dist = props[0] + 1U;

	*options = opt;

	return LZMA_OK;
}